

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int serialGet7(uchar *buf,Mem *pMem)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  u32 y;
  u64 x;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)*in_RDI << 0x18 | (uint)in_RDI[1] << 0x10;
  uVar3 = CONCAT44(uVar2 | (uint)in_RDI[2] << 8 | (uint)in_RDI[3],
                   (uint)in_RDI[4] << 0x18 | (uint)in_RDI[5] << 0x10 | (uint)in_RDI[6] << 8 |
                   (uint)in_RDI[7]);
  *in_RSI = uVar3;
  if (((uVar2 & 0x7ff00000) == 0x7ff00000) && ((uVar3 & 0xfffffffffffff) != 0)) {
    *(undefined2 *)((long)in_RSI + 0x14) = 1;
    local_14 = 1;
  }
  else {
    *(undefined2 *)((long)in_RSI + 0x14) = 8;
    local_14 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

static int serialGet7(
  const unsigned char *buf,     /* Buffer to deserialize from */
  Mem *pMem                     /* Memory cell to write value into */
){
  u64 x = FOUR_BYTE_UINT(buf);
  u32 y = FOUR_BYTE_UINT(buf+4);
  x = (x<<32) + y;
  assert( sizeof(x)==8 && sizeof(pMem->u.r)==8 );
  swapMixedEndianFloat(x);
  memcpy(&pMem->u.r, &x, sizeof(x));
  if( IsNaN(x) ){
    pMem->flags = MEM_Null;
    return 1;
  }
  pMem->flags = MEM_Real;
  return 0;
}